

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerThread.cxx
# Opt level: O3

bool testStackFrameFunctionName(void)

{
  undefined8 this;
  int iVar1;
  ostream *poVar2;
  StackTraceResponse stackTrace;
  shared_ptr<cmDebugger::cmDebuggerThread> thread;
  undefined1 local_c9;
  undefined1 local_c8 [16];
  undefined1 local_b8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_58;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_38;
  long local_20 [2];
  
  local_c8._0_8_ = local_c8._0_8_ & 0xffffffff00000000;
  local_b8._32_8_ = (cmDebuggerThread *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmDebugger::cmDebuggerThread,std::allocator<cmDebugger::cmDebuggerThread>,int,char_const(&)[5]>
            (&local_90,(cmDebuggerThread **)(local_b8 + 0x20),
             (allocator<cmDebugger::cmDebuggerThread> *)&local_58,(int *)local_c8,
             (char (*) [5])0x930da8);
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"function_name","");
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector(&local_38,&local_58);
  local_20[1] = 10;
  local_20[0] = 0x14;
  local_c8._0_8_ = (Implementation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),
             (Implementation **)local_c8,(allocator<cmListFileFunction::Implementation> *)&local_c9,
             &local_78,local_20 + 1,local_20,&local_38);
  local_88._M_allocated_capacity = local_c8._0_8_;
  local_88._8_8_ = local_c8._8_8_;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  this = local_b8._32_8_;
  local_c8._0_8_ = (Implementation *)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CMakeLists.txt","");
  cmDebugger::cmDebuggerThread::PushStackFrame
            ((cmDebuggerThread *)this,(cmMakefile *)0x0,(string *)local_c8,
             (cmListFileFunction *)&local_88);
  if ((Implementation *)local_c8._0_8_ != (Implementation *)local_b8) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._0_8_ + 1));
  }
  cmDebugger::GetStackTraceResponse
            ((StackTraceResponse *)local_c8,
             (shared_ptr<cmDebugger::cmDebuggerThread> *)(local_b8 + 0x20));
  iVar1 = std::__cxx11::string::compare((char *)(local_c8._0_8_ + 0xa8));
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(stackTrace.stackFrames[0].name == functionName) failed on line ",0x4b);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>::~vector
            ((vector<dap::StackFrame,_std::allocator<dap::StackFrame>_> *)local_c8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_58);
  if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
  }
  return iVar1 == 0;
}

Assistant:

static bool testStackFrameFunctionName()
{
  auto thread = std::make_shared<cmDebugger::cmDebuggerThread>(0, "name");
  const auto* functionName = "function_name";
  auto arguments = std::vector<cmListFileArgument>{};
  cmListFileFunction func(functionName, 10, 20, arguments);
  thread->PushStackFrame(nullptr, "CMakeLists.txt", func);

  auto stackTrace = GetStackTraceResponse(thread);

  ASSERT_TRUE(stackTrace.stackFrames[0].name == functionName);
  return true;
}